

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFindPackageCommand::RestoreFindDefinitions(cmFindPackageCommand *this)

{
  cmMakefile *this_00;
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->OriginalDefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->OriginalDefs)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_00 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    if ((char)p_Var1[2]._M_color == _S_black) {
      cmMakefile::AddDefinition(this_00,(string *)(p_Var1 + 1),(char *)p_Var1[2]._M_parent);
    }
    else {
      cmMakefile::RemoveDefinition(this_00,(string *)(p_Var1 + 1));
    }
  }
  return;
}

Assistant:

void cmFindPackageCommand::RestoreFindDefinitions()
{
  for (std::map<std::string, OriginalDef>::iterator i =
         this->OriginalDefs.begin();
       i != this->OriginalDefs.end(); ++i) {
    OriginalDef const& od = i->second;
    if (od.exists) {
      this->Makefile->AddDefinition(i->first, od.value.c_str());
    } else {
      this->Makefile->RemoveDefinition(i->first);
    }
  }
}